

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::PostProcessFloat
                   (string *__return_storage_ptr__,string *result)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  allocator local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [39];
  byte local_79;
  undefined1 local_78 [7];
  bool exp_neg;
  string exponent;
  string mantissa;
  size_type exp_pos;
  allocator local_19;
  string *local_18;
  string *result_local;
  
  local_18 = result;
  result_local = __return_storage_ptr__;
  bVar1 = std::operator==(result,"inf");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Infinity",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = std::operator==(result,"-inf");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"-Infinity",(allocator *)((long)&exp_pos + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&exp_pos + 3));
    }
    else {
      bVar1 = std::operator==(result,"nan");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"NaN",(allocator *)((long)&exp_pos + 2));
        std::allocator<char>::~allocator((allocator<char> *)((long)&exp_pos + 2));
      }
      else {
        lVar2 = std::__cxx11::string::find((char)result,0x65);
        if (lVar2 == -1) {
          lVar2 = std::__cxx11::string::find((char)result,0x2e);
          if (lVar2 == -1) {
            std::__cxx11::string::operator+=((string *)result,".0");
          }
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)result);
        }
        else {
          std::__cxx11::string::substr((ulong)((long)&exponent.field_2 + 8),(ulong)result);
          std::__cxx11::string::substr((ulong)local_78,(ulong)result);
          lVar2 = std::__cxx11::string::find((char)&exponent + '\x18',0x2e);
          if (lVar2 == -1) {
            std::__cxx11::string::operator+=((string *)(exponent.field_2._M_local_buf + 8),".0");
          }
          local_79 = 0;
          uVar3 = std::__cxx11::string::empty();
          if (((uVar3 & 1) == 0) &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_78), *pcVar4 == '+')) {
            std::__cxx11::string::substr((ulong)local_a0,(ulong)local_78);
            std::__cxx11::string::operator=((string *)local_78,local_a0);
            std::__cxx11::string::~string(local_a0);
          }
          else {
            uVar3 = std::__cxx11::string::empty();
            if (((uVar3 & 1) == 0) &&
               (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_78), *pcVar4 == '-'))
            {
              local_79 = 1;
              std::__cxx11::string::substr((ulong)local_c0,(ulong)local_78);
              std::__cxx11::string::operator=((string *)local_78,local_c0);
              std::__cxx11::string::~string(local_c0);
            }
          }
          while( true ) {
            uVar3 = std::__cxx11::string::size();
            bVar1 = false;
            if (1 < uVar3) {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_78);
              bVar1 = *pcVar4 == '0';
            }
            if (!bVar1) break;
            std::__cxx11::string::substr((ulong)local_e0,(ulong)local_78);
            std::__cxx11::string::operator=((string *)local_78,local_e0);
            std::__cxx11::string::~string(local_e0);
          }
          std::operator+(&local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&exponent.field_2 + 8),"E");
          pcVar4 = "";
          if ((local_79 & 1) != 0) {
            pcVar4 = "-";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_140,pcVar4,&local_141);
          std::operator+(&local_100,&local_120,&local_140);
          std::operator+(__return_storage_ptr__,&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)local_78);
          std::__cxx11::string::~string((string *)(exponent.field_2._M_local_buf + 8));
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string PostProcessFloat(string result) {
  // If inf, -inf or nan, replace with +Infinity, -Infinity or NaN.
  if (result == "inf") {
    return "Infinity";
  } else if (result == "-inf") {
    return "-Infinity";
  } else if (result == "nan") {
    return "NaN";
  }

  // If scientific notation (e.g., "1e10"), (i) capitalize the "e", (ii)
  // ensure that the mantissa (portion prior to the "e") has at least one
  // fractional digit (after the decimal point), and (iii) strip any unnecessary
  // leading zeroes and/or '+' signs from the exponent.
  string::size_type exp_pos = result.find('e');
  if (exp_pos != string::npos) {
    string mantissa = result.substr(0, exp_pos);
    string exponent = result.substr(exp_pos + 1);

    // Add ".0" to mantissa if no fractional part exists.
    if (mantissa.find('.') == string::npos) {
      mantissa += ".0";
    }

    // Strip the sign off the exponent and store as |exp_neg|.
    bool exp_neg = false;
    if (!exponent.empty() && exponent[0] == '+') {
      exponent = exponent.substr(1);
    } else if (!exponent.empty() && exponent[0] == '-') {
      exp_neg = true;
      exponent = exponent.substr(1);
    }

    // Strip any leading zeroes off the exponent.
    while (exponent.size() > 1 && exponent[0] == '0') {
      exponent = exponent.substr(1);
    }

    return mantissa + "E" + string(exp_neg ? "-" : "") + exponent;
  }

  // Otherwise, this is an ordinary decimal number. Append ".0" if result has no
  // decimal/fractional part in order to match output of original codegen.
  if (result.find('.') == string::npos) {
    result += ".0";
  }

  return result;
}